

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O2

GreaterThanLayerParams * __thiscall
CoreML::Specification::GreaterThanLayerParams::New(GreaterThanLayerParams *this,Arena *arena)

{
  GreaterThanLayerParams *this_00;
  
  this_00 = (GreaterThanLayerParams *)operator_new(0x18);
  GreaterThanLayerParams(this_00);
  if (arena != (Arena *)0x0) {
    google::protobuf::Arena::Own<CoreML::Specification::GreaterThanLayerParams>(arena,this_00);
  }
  return this_00;
}

Assistant:

GreaterThanLayerParams* GreaterThanLayerParams::New(::google::protobuf::Arena* arena) const {
  GreaterThanLayerParams* n = new GreaterThanLayerParams;
  if (arena != NULL) {
    arena->Own(n);
  }
  return n;
}